

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int make_canonical(ly_ctx *ctx,int type,char **value,void *data1,void *data2)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  char *__string;
  uint8_t *puVar5;
  char *pcVar6;
  uint8_t c;
  uint64_t unum;
  int64_t num;
  int ret;
  int count;
  int j;
  int i;
  char *module_name;
  lys_type_bit **bits;
  char *str;
  char *buf_backup;
  char *buf;
  void *data2_local;
  void *data1_local;
  char **value_local;
  int type_local;
  ly_ctx *ctx_local;
  
  __string = ly_buf();
  str = (char *)0x0;
  num._0_4_ = 0;
  puVar5 = ly_buf_used_location();
  if ((*puVar5 != '\0') && (*__string != '\0')) {
    str = strndup(__string,0x3ff);
  }
  puVar5 = ly_buf_used_location();
  *puVar5 = *puVar5 + '\x01';
  switch(type) {
  case 2:
    iVar4 = *data2;
    *__string = '\0';
    for (count = 0; count < iVar4; count = count + 1) {
      if (*(long *)((long)data1 + (long)count * 8) != 0) {
        if (*__string == '\0') {
          sprintf(__string,"%s",**(undefined8 **)((long)data1 + (long)count * 8));
        }
        else {
          pcVar6 = strdup(__string);
          sprintf(__string,"%s %s",pcVar6,**(undefined8 **)((long)data1 + (long)count * 8));
          free(pcVar6);
        }
      }
    }
    break;
  default:
    goto LAB_00131007;
  case 4:
    lVar2 = *data1;
    bVar1 = *data2;
    if (lVar2 == 0) {
      sprintf(__string,"0.0");
    }
    else {
      num._4_4_ = sprintf(__string,"%ld ",lVar2);
      if (num._4_4_ + -1 <= (int)(uint)bVar1) {
        num._4_4_ = sprintf(__string,"0%0*ld ",(ulong)bVar1,lVar2);
      }
      bVar3 = true;
      for (count = (int)bVar1; 0 < count; count = count + -1) {
        if (((bVar3) && (1 < count)) && (__string[num._4_4_ + -2] == '0')) {
          __string[num._4_4_ + -1] = '\0';
        }
        else {
          bVar3 = false;
          __string[num._4_4_ + -1] = __string[num._4_4_ + -2];
        }
        num._4_4_ = num._4_4_ + -1;
      }
      __string[num._4_4_ + -1] = '.';
    }
    break;
  case 7:
    pcVar6 = strchr(*value,0x3a);
    if (pcVar6 == (char *)0x0) {
      sprintf(__string,"%s:%s",data1,*value);
    }
    else {
      strcpy(__string,*value);
    }
    break;
  case 0xc:
  case 0xe:
  case 0x10:
  case 0x12:
    sprintf(__string,"%ld",*data1);
    break;
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x13:
    sprintf(__string,"%lu",*data1);
  }
  iVar4 = strcmp(__string,*value);
  if (iVar4 != 0) {
    lydict_remove(ctx,*value);
    pcVar6 = lydict_insert(ctx,__string,0);
    *value = pcVar6;
  }
  num._0_4_ = (uint)(iVar4 != 0);
LAB_00131007:
  if (str != (char *)0x0) {
    strcpy(__string,str);
    free(str);
  }
  puVar5 = ly_buf_used_location();
  *puVar5 = *puVar5 + 0xff;
  return (uint)num;
}

Assistant:

static int
make_canonical(struct ly_ctx *ctx, int type, const char **value, void *data1, void *data2)
{
    char *buf = ly_buf(), *buf_backup = NULL, *str;
    struct lys_type_bit **bits = NULL;
    const char *module_name;
    int i, j, count, ret = 0;
    int64_t num;
    uint64_t unum;
    uint8_t c;

    /* prepare buffer for creating canonical representation */
    if (ly_buf_used && buf[0]) {
        buf_backup = strndup(buf, LY_BUF_SIZE - 1);
    }
    ly_buf_used++;

    switch (type) {
    case LY_TYPE_BITS:
        bits = (struct lys_type_bit **)data1;
        count = *((int *)data2);
        /* in canonical form, the bits are ordered by their position */
        buf[0] = '\0';
        for (i = 0; i < count; i++) {
            if (!bits[i]) {
                /* bit not set */
                continue;
            }
            if (buf[0]) {
                str = strdup(buf);
                sprintf(buf, "%s %s", str, bits[i]->name);
                free(str);
            } else {
                sprintf(buf, "%s", bits[i]->name);
            }
        }
        break;

    case LY_TYPE_IDENT:
        module_name = (const char *)data1;
        /* identity must always have a prefix */
        if (!strchr(*value, ':')) {
            sprintf(buf, "%s:%s", module_name, *value);
        } else {
            strcpy(buf, *value);
        }
        break;

    case LY_TYPE_DEC64:
        num = *((int64_t *)data1);
        c = *((uint8_t *)data2);
        if (num) {
            count = sprintf(buf, "%"PRId64" ", num);
            if ((count - 1) <= c) {
                /* we have 0. value, print the value with the leading zeros
                 * (one for 0. and also keep the correct with of num according
                 * to fraction-digits value) */
                count = sprintf(buf, "0%0*"PRId64" ", c, num);
            }
            for (i = c, j = 1; i > 0 ; i--) {
                if (j && i > 1 && buf[count - 2] == '0') {
                    /* we have trailing zero to skip */
                    buf[count - 1] = '\0';
                } else {
                    j = 0;
                    buf[count - 1] = buf[count - 2];
                }
                count--;
            }
            buf[count - 1] = '.';
        } else {
            /* zero */
            sprintf(buf, "0.0");
        }
        break;

    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
        num = *((int64_t *)data1);
        sprintf(buf, "%"PRId64, num);
        break;

    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        unum = *((uint64_t *)data1);
        sprintf(buf, "%"PRIu64, unum);
        break;

    default:
        /* should not be even called - just do nothing */
        goto cleanup;
    }

    if (strcmp(buf, *value)) {
        lydict_remove(ctx, *value);
        *value = lydict_insert(ctx, buf, 0);
        ret = 1;
    }

cleanup:
    if (buf_backup) {
        /* return previous internal buffer content */
        strcpy(buf, buf_backup);
        free(buf_backup);
    }
    ly_buf_used--;

    return ret;
}